

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O0

int WriteDataLIRMIA3(LIRMIA3 *pLIRMIA3,uchar M1,uchar M2,uchar M3,uchar M4)

{
  int iVar1;
  uint8 local_128 [3];
  uchar local_125;
  int sendbuflen;
  uchar sendbuf [256];
  uchar M4_local;
  uchar M3_local;
  uchar M2_local;
  uchar M1_local;
  LIRMIA3 *pLIRMIA3_local;
  
  memset(local_128,0,0x100);
  local_128[0] = 'T';
  local_128[1] = 4;
  local_128[2] = 4;
  local_125 = M1;
  sendbuflen._0_1_ = M2;
  sendbuflen._1_1_ = M3;
  sendbuflen._2_1_ = M4;
  iVar1 = WriteAllRS232Port(&pLIRMIA3->RS232Port,local_128,7);
  if (iVar1 == 0) {
    if ((pLIRMIA3->bSaveRawData != 0) && (pLIRMIA3->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_128,7,1,(FILE *)pLIRMIA3->pfSaveFile);
      fflush((FILE *)pLIRMIA3->pfSaveFile);
    }
    mSleep(10);
    pLIRMIA3_local._4_4_ = 0;
  }
  else {
    pLIRMIA3_local._4_4_ = 1;
  }
  return pLIRMIA3_local._4_4_;
}

Assistant:

inline int WriteDataLIRMIA3(LIRMIA3* pLIRMIA3, unsigned char M1, unsigned char M2, unsigned char M3, unsigned char M4)
{
	unsigned char sendbuf[MAX_NB_BYTES_LIRMIA3];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	sendbuf[1] = (unsigned char)0x04; // I2C address
	sendbuf[2] = (unsigned char)0x04; // Number of bytes to write
	sendbuf[3] = M1;
	sendbuf[4] = M2;
	sendbuf[5] = M3;
	sendbuf[6] = M4;
	sendbuflen = 7;
	
	if (WriteAllRS232Port(&pLIRMIA3->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pLIRMIA3->bSaveRawData)&&(pLIRMIA3->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pLIRMIA3->pfSaveFile);
		fflush(pLIRMIA3->pfSaveFile);
	}

	mSleep(10);

	return EXIT_SUCCESS;
}